

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x11_window.c
# Opt level: O0

void releaseMonitor(_GLFWwindow *window)

{
  long in_RDI;
  _GLFWmonitor *in_stack_00000020;
  
  if (*(long *)(*(long *)(in_RDI + 0x48) + 0x18) == in_RDI) {
    _glfwInputMonitorWindow(*(_GLFWmonitor **)(in_RDI + 0x48),(_GLFWwindow *)0x0);
    _glfwRestoreVideoModeX11(in_stack_00000020);
    _glfw.x11.saver.count = _glfw.x11.saver.count + -1;
    if (_glfw.x11.saver.count == 0) {
      (*_glfw.x11.xlib.SetScreenSaver)
                (_glfw.x11.display,_glfw.x11.saver.timeout,_glfw.x11.saver.interval,
                 _glfw.x11.saver.blanking,_glfw.x11.saver.exposure);
    }
  }
  return;
}

Assistant:

static void releaseMonitor(_GLFWwindow* window)
{
    if (window->monitor->window != window)
        return;

    _glfwInputMonitorWindow(window->monitor, NULL);
    _glfwRestoreVideoModeX11(window->monitor);

    _glfw.x11.saver.count--;

    if (_glfw.x11.saver.count == 0)
    {
        // Restore old screen saver settings
        XSetScreenSaver(_glfw.x11.display,
                        _glfw.x11.saver.timeout,
                        _glfw.x11.saver.interval,
                        _glfw.x11.saver.blanking,
                        _glfw.x11.saver.exposure);
    }
}